

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcPlateType::IfcPlateType(IfcPlateType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcPlateType";
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__0077acd8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x77aba8;
  *(undefined8 *)&this->field_0x1c0 = 0x77acc0;
  *(undefined8 *)&this->field_0x88 = 0x77abd0;
  *(undefined8 *)&this->field_0x98 = 0x77abf8;
  *(undefined8 *)&this->field_0xf0 = 0x77ac20;
  *(undefined8 *)&this->field_0x148 = 0x77ac48;
  *(undefined8 *)&this->field_0x180 = 0x77ac70;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x77ac98;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>).field_0x10
       = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>).field_0x18
       = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcPlateType() : Object("IfcPlateType") {}